

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Scl_LibertyReadLoadUnit(Scl_Tree_t *p,Vec_Str_t *vOut)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  char cVar8;
  double dVar9;
  
  pSVar2 = p->pItems;
  uVar4 = pSVar2->Child;
  iVar1 = p->nItems;
  if (iVar1 <= (int)uVar4) {
LAB_003d0a89:
    __assert_fail("v < p->nItems",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                  ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
  }
  if (-1 < (int)uVar4) {
    pcVar7 = p->pContents;
    while( true ) {
      iVar6 = pSVar2[uVar4].Key.Beg;
      iVar5 = pSVar2[uVar4].Key.End - iVar6;
      iVar6 = strncmp(pcVar7 + iVar6,"capacitive_load_unit",(long)iVar5);
      if (iVar5 == 0x14 && iVar6 == 0) break;
      uVar4 = pSVar2[uVar4].Next;
      if (iVar1 <= (int)uVar4) goto LAB_003d0a89;
      if (((int)uVar4 < 0) || (pSVar2 == (Scl_Item_t *)0x0)) goto LAB_003d096d;
    }
    pcVar7 = Scl_LibertyReadString(p,pSVar2[uVar4].Head);
    pcVar7 = strtok(pcVar7," \t\n\r\\\",");
    dVar9 = atof(pcVar7);
    pcVar7 = strtok((char *)0x0," \t\n\r\\\",");
    Vec_StrPutF_(vOut,(float)dVar9);
    if (pcVar7 != (char *)0x0) {
      if (*pcVar7 == 'f') {
        if ((pcVar7[1] == 'f') && (pcVar7[2] == '\0')) {
          uVar4 = vOut->nSize;
          if (uVar4 == vOut->nCap) {
            if ((int)uVar4 < 0x10) {
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,0x10);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar4 * 2;
              if (vOut->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar3);
              }
              else {
                pcVar7 = (char *)realloc(vOut->pArray,sVar3);
              }
              vOut->pArray = pcVar7;
              vOut->nCap = (int)sVar3;
            }
          }
          else {
            pcVar7 = vOut->pArray;
          }
          cVar8 = '\x0f';
          goto LAB_003d09f9;
        }
      }
      else if (((*pcVar7 == 'p') && (pcVar7[1] == 'f')) && (pcVar7[2] == '\0')) goto LAB_003d098e;
    }
  }
LAB_003d096d:
  puts("Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf)."
      );
  Vec_StrPutF_(vOut,1.0);
LAB_003d098e:
  uVar4 = vOut->nSize;
  if (uVar4 == vOut->nCap) {
    if ((int)uVar4 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar7;
      vOut->nCap = 0x10;
    }
    else {
      sVar3 = (ulong)uVar4 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar3);
      }
      else {
        pcVar7 = (char *)realloc(vOut->pArray,sVar3);
      }
      vOut->pArray = pcVar7;
      vOut->nCap = (int)sVar3;
    }
  }
  else {
    pcVar7 = vOut->pArray;
  }
  cVar8 = '\f';
LAB_003d09f9:
  iVar1 = vOut->nSize;
  vOut->nSize = iVar1 + 1;
  pcVar7[iVar1] = cVar8;
  return;
}

Assistant:

void Scl_LibertyReadLoadUnit( Scl_Tree_t * p, Vec_Str_t * vOut )
{
    Scl_Item_t * pItem;
    Scl_ItemForEachChildName( p, Scl_LibertyRoot(p), pItem, "capacitive_load_unit" )
    {
        // expecting (1.00,ff) or (1, pf) ... 12 or 15 for 'pf' or 'ff'
        char * pHead   = Scl_LibertyReadString(p, pItem->Head);
        float First    = atof(strtok(pHead, " \t\n\r\\\","));
        char * pSecond = strtok(NULL, " \t\n\r\\\",");
        Vec_StrPutF_( vOut, First );
        if ( pSecond && !strcmp(pSecond, "pf") )
            Vec_StrPutI_( vOut, 12 );
        else if ( pSecond && !strcmp(pSecond, "ff") )
            Vec_StrPutI_( vOut, 15 );
        else break;
        return;
    }
    printf( "Libery parser cannot read \"capacitive_load_unit\". Assuming   capacitive_load_unit(1, pf).\n" );
    Vec_StrPutF_( vOut, 1.0 );
    Vec_StrPutI_( vOut, 12 );
}